

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLSSetUserData(void *arkode_mem,void *user_data)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetUserData",&local_10,&local_18);
  if (iVar1 == 0) {
    if (local_18->jacDQ == 0) {
      local_18->J_data = user_data;
    }
    if (local_18->jtimesDQ == 0) {
      local_18->Jt_data = user_data;
    }
    if (local_18->user_linsys != 0) {
      local_18->A_data = user_data;
    }
    local_18->P_data = user_data;
  }
  return iVar1;
}

Assistant:

int arkLSSetUserData(void *arkode_mem, void* user_data)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetUserData",
                            &ark_mem, &arkls_mem);
  if (retval != ARKLS_SUCCESS) return(retval);

  /* Set data for Jacobian */
  if (!arkls_mem->jacDQ)
    arkls_mem->J_data = user_data;

  /* Set data for Jtimes */
  if (!arkls_mem->jtimesDQ)
    arkls_mem->Jt_data = user_data;

  /* Set data for LinSys */
  if (arkls_mem->user_linsys)
    arkls_mem->A_data = user_data;

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return(ARKLS_SUCCESS);
}